

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *pIVar1;
  bool *pbVar2;
  ImVector<ImGuiPopupData> *this;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *pIVar6;
  undefined1 auVar7 [32];
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImGuiContext *g;
  ImGuiTable *pIVar11;
  ImDrawList *pIVar12;
  ImGuiViewportP **ppIVar13;
  ImDrawList **ppIVar14;
  ImGuiPopupData *pIVar15;
  ImGuiTabBar *tab_bar;
  ImGuiSettingsHandler *pIVar16;
  ImGuiWindowSettings *settings;
  ImGuiTableSettings *settings_00;
  ImGuiWindow **ppIVar17;
  ImU32 col;
  char *pcVar18;
  char *pcVar19;
  int rect_n;
  long lVar20;
  ImVector<ImGuiViewportP_*> *this_00;
  int draw_list_i;
  uint uVar21;
  int iVar22;
  char *pcVar23;
  int rect_n_1;
  int iVar24;
  ulong uVar25;
  ImVector<ImDrawList_*> *this_01;
  undefined1 auVar26 [8];
  int column_n;
  ulong uVar27;
  ImVector<ImGuiViewportP_*> *this_02;
  int n_5;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar45;
  undefined1 auVar39 [64];
  undefined1 auVar46 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 extraout_var [60];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar51 [64];
  undefined1 auVar59 [56];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar64;
  undefined1 in_ZMM6 [64];
  undefined1 auVar63 [64];
  double dVar65;
  ImRect IVar66;
  ImVec2 local_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  int *local_1c0;
  int *local_1b8;
  ImGuiMetricsConfig *local_1b0;
  ImVector<ImGuiViewportP_*> *local_1a8;
  ImVec2 local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  char buf [128];
  char *trt_rects_names [13];
  char *wrt_rects_names [8];
  undefined1 auVar62 [16];
  
  auVar61 = in_ZMM6._0_16_;
  bVar10 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar8 = GImGui;
  if (!bVar10) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.82 WIP");
  fVar28 = (pIVar8->IO).Framerate;
  auVar48._0_8_ = (double)fVar28;
  auVar48._8_8_ = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar28),auVar48._0_8_);
  uVar21 = (pIVar8->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar8->IO).MetricsRenderVertices,
       (ulong)uVar21,(long)(int)uVar21 / 3 & 0xffffffff);
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar8->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar8->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar8->IO).MetricsActiveAllocations);
  Separator();
  auVar7 = _PTR_anon_var_dwarf_116354_0029fa30;
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  trt_rects_names[0xc] = "ColumnsContentUnfrozen";
  trt_rects_names[8] = "ColumnsClipRect";
  trt_rects_names[9] = "ColumnsContentHeadersUsed";
  trt_rects_names[10] = "ColumnsContentHeadersIdeal";
  trt_rects_names[0xb] = "ColumnsContentFrozen";
  trt_rects_names[4] = "InnerClipRect";
  trt_rects_names[5] = "BackgroundClipRect";
  trt_rects_names[6] = "ColumnsRect";
  trt_rects_names[7] = "ColumnsWorkRect";
  trt_rects_names[0] = PTR_anon_var_dwarf_116354_0029fa30;
  trt_rects_names[1] = PTR_anon_var_dwarf_11636c_0029fa38;
  trt_rects_names[2] = (char *)_UNK_0029fa40;
  trt_rects_names[3] = (char *)_UNK_0029fa48;
  local_1b8 = &(pIVar8->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1b8 = 4;
  }
  local_1c0 = &(pIVar8->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1c0 = 2;
  }
  local_1b0 = &pIVar8->DebugMetricsConfig;
  auVar51 = ZEXT1664(auVar7._0_16_);
  auVar39 = ZEXT1664(auVar48);
  auVar63 = ZEXT1664(auVar61);
  bVar10 = TreeNode("Tools");
  if (bVar10) {
    auVar61._8_8_ = 0;
    auVar61[0] = buf[8];
    auVar61[1] = buf[9];
    auVar61[2] = buf[10];
    auVar61[3] = buf[0xb];
    auVar61[4] = buf[0xc];
    auVar61[5] = buf[0xd];
    auVar61[6] = buf[0xe];
    auVar61[7] = buf[0xf];
    buf._0_16_ = auVar61 << 0x40;
    bVar10 = Button("Item Picker..",(ImVec2 *)buf);
    if (bVar10) {
      GImGui->DebugItemPickerActive = true;
    }
    SameLine(0.0,-1.0);
    TextDisabled("(?)");
    bVar10 = IsItemHovered(0);
    if (bVar10) {
      BeginTooltip();
      PushTextWrapPos(GImGui->FontSize * 35.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      PopTextWrapPos();
      EndTooltip();
    }
    Checkbox("Show windows begin order",&(pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1b0->ShowWindowsRects);
    auVar51 = ZEXT464(0xbf800000);
    SameLine(0.0,-1.0);
    pIVar9 = GImGui;
    fVar28 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar28 * 12.0;
    bVar10 = Combo("##show_windows_rect_type",local_1b8,wrt_rects_names,8,8);
    pIVar1 = &pIVar8->DebugMetricsConfig;
    pIVar1->ShowWindowsRects = (bool)(pIVar1->ShowWindowsRects | bVar10);
    if ((pIVar1->ShowWindowsRects != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
      lVar20 = 0;
      BulletText("\'%s\':",pIVar8->NavWindow->Name);
      auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
      Indent(0.0);
      while( true ) {
        auVar59 = auVar51._8_56_;
        auVar46 = auVar39._8_56_;
        if (lVar20 == 8) break;
        IVar66 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar8->NavWindow,(int)lVar20);
        auVar52._0_8_ = IVar66.Max;
        auVar52._8_56_ = auVar59;
        auVar39._0_8_ = IVar66.Min;
        auVar39._8_56_ = auVar46;
        auVar62._0_8_ = (double)IVar66.Min.x;
        auVar62._8_8_ = auVar46._0_8_;
        auVar63 = ZEXT1664(auVar62);
        auVar61 = vmovshdup_avx(auVar39._0_16_);
        dVar65 = (double)auVar61._0_4_;
        auVar48 = vmovshdup_avx(auVar52._0_16_);
        auVar39 = ZEXT1664(auVar62);
        auVar51 = ZEXT1664(CONCAT88(auVar61._8_8_,dVar65));
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",auVar62._0_8_,dVar65,
             (double)IVar66.Max.x,(double)auVar48._0_4_,(double)(IVar66.Max.x - IVar66.Min.x),
             (double)(auVar48._0_4_ - auVar61._0_4_),wrt_rects_names[lVar20]);
        lVar20 = lVar20 + 1;
      }
      Unindent(0.0);
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar8->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar8->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    Checkbox("Show tables rectangles",&(pIVar8->DebugMetricsConfig).ShowTablesRects);
    auVar39 = ZEXT464(0xbf800000);
    SameLine(0.0,-1.0);
    pIVar9 = GImGui;
    fVar28 = GImGui->FontSize * 12.0;
    auVar51 = ZEXT464((uint)fVar28);
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar28;
    bVar10 = Combo("##show_table_rects_type",local_1c0,trt_rects_names,0xd,0xd);
    pbVar2 = &(pIVar8->DebugMetricsConfig).ShowTablesRects;
    *pbVar2 = (bool)(*pbVar2 | bVar10);
    if ((*pbVar2 != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
      auVar26 = (undefined1  [8])&pIVar8->Tables;
      local_188 = auVar26;
      for (iVar24 = 0; iVar24 < ((ImVector<ImGuiTable> *)auVar26)->Size; iVar24 = iVar24 + 1) {
        pIVar11 = ImVector<ImGuiTable>::operator[]((ImVector<ImGuiTable> *)auVar26,iVar24);
        if (pIVar8->FrameCount + -1 <= pIVar11->LastFrameActive) {
          if ((pIVar11->OuterWindow == pIVar8->NavWindow) ||
             (pIVar11->InnerWindow == pIVar8->NavWindow)) {
            local_1a8 = (ImVector<ImGuiViewportP_*> *)CONCAT44(local_1a8._4_4_,iVar24);
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar11->ID,
                       (ulong)(uint)pIVar11->ColumnsCount,pIVar11->OuterWindow->Name);
            bVar10 = IsItemHovered(0);
            if (bVar10) {
              pIVar12 = GetForegroundDrawList();
              IVar3 = (pIVar11->OuterRect).Min;
              auVar29._0_4_ = IVar3.x + -1.0;
              auVar29._4_4_ = IVar3.y + -1.0;
              auVar29._8_4_ = 0xbf800000;
              auVar29._12_4_ = 0xbf800000;
              uVar64 = vmovlps_avx(auVar29);
              buf[0] = (char)uVar64;
              buf[1] = (char)((ulong)uVar64 >> 8);
              buf[2] = (char)((ulong)uVar64 >> 0x10);
              buf[3] = (char)((ulong)uVar64 >> 0x18);
              buf[4] = (char)((ulong)uVar64 >> 0x20);
              buf[5] = (char)((ulong)uVar64 >> 0x28);
              buf[6] = (char)((ulong)uVar64 >> 0x30);
              buf[7] = (char)((ulong)uVar64 >> 0x38);
              IVar3 = (pIVar11->OuterRect).Max;
              auVar30._0_4_ = IVar3.x + 1.0;
              auVar30._4_4_ = IVar3.y + 1.0;
              auVar30._8_4_ = 0x3f800000;
              auVar30._12_4_ = 0x3f800000;
              local_1e0 = (ImVec2)vmovlps_avx(auVar30);
              auVar39 = ZEXT464(0x40000000);
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,&local_1e0,0xff00ffff,0.0,-1,2.0);
            }
            auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
            Indent(0.0);
            uVar25 = 0;
            while( true ) {
              auVar59 = auVar39._8_56_;
              auVar46 = auVar51._8_56_;
              if (uVar25 == 0xd) break;
              iVar24 = (int)uVar25;
              if (uVar25 < 6) {
                IVar66 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,iVar24,-1);
                auVar54._0_8_ = IVar66.Max;
                auVar54._8_56_ = auVar59;
                auVar63._0_8_ = IVar66.Min;
                auVar63._8_56_ = auVar46;
                _local_198 = auVar63._0_16_;
                _local_1d8 = auVar54._0_16_;
                auVar61 = vmovshdup_avx(_local_1d8);
                auVar48 = vmovshdup_avx(_local_198);
                auVar63 = ZEXT1664(auVar48);
                dVar65 = (double)IVar66.Min.x;
                auVar51 = ZEXT1664(CONCAT88(auVar46._0_8_,dVar65));
                dVar47 = (double)auVar48._0_4_;
                auVar39 = ZEXT1664(CONCAT88(auVar48._8_8_,dVar47));
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar65,
                               dVar47,(double)IVar66.Max.x,(double)auVar61._0_4_,
                               (double)(IVar66.Max.x - IVar66.Min.x),
                               (double)(auVar61._0_4_ - auVar48._0_4_),trt_rects_names[uVar25]);
                local_1e0.x = 0.0;
                local_1e0.y = 0.0;
                Selectable(buf,false,0,&local_1e0);
                bVar10 = IsItemHovered(0);
                if (bVar10) {
                  pIVar12 = GetForegroundDrawList();
                  auVar33._0_4_ = (float)local_198._0_4_ + -1.0;
                  auVar33._4_4_ = (float)local_198._4_4_ + -1.0;
                  auVar33._8_4_ = fStack_190 + -1.0;
                  auVar33._12_4_ = fStack_18c + -1.0;
                  local_1e0 = (ImVec2)vmovlps_avx(auVar33);
                  auVar34._0_4_ = (float)local_1d8._0_4_ + 1.0;
                  auVar34._4_4_ = (float)local_1d8._4_4_ + 1.0;
                  auVar34._8_4_ = fStack_1d0 + 1.0;
                  auVar34._12_4_ = fStack_1cc + 1.0;
                  local_1a0 = (ImVec2)vmovlps_avx(auVar34);
                  auVar51 = ZEXT464(0) << 0x20;
                  auVar39 = ZEXT464(0x40000000);
                  ImDrawList::AddRect(pIVar12,&local_1e0,&local_1a0,0xff00ffff,0.0,-1,2.0);
                }
              }
              else if ((iVar24 == 8) || (iVar24 == 6)) {
                uVar27 = 0;
                while( true ) {
                  auVar59 = auVar39._8_56_;
                  auVar46 = auVar51._8_56_;
                  iVar22 = (int)uVar27;
                  if (pIVar11->ColumnsCount <= iVar22) break;
                  IVar66 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,iVar24,iVar22);
                  auVar53._0_8_ = IVar66.Max;
                  auVar53._8_56_ = auVar59;
                  auVar40._0_8_ = IVar66.Min;
                  auVar40._8_56_ = auVar46;
                  _local_198 = auVar40._0_16_;
                  _local_1d8 = auVar53._0_16_;
                  auVar61 = vmovshdup_avx(_local_1d8);
                  auVar48 = vmovshdup_avx(_local_198);
                  auVar63 = ZEXT1664(auVar48);
                  dVar65 = (double)IVar66.Min.x;
                  auVar51 = ZEXT1664(CONCAT88(auVar46._0_8_,dVar65));
                  dVar47 = (double)auVar48._0_4_;
                  auVar39 = ZEXT1664(CONCAT88(auVar48._8_8_,dVar47));
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,dVar65,dVar47,(double)IVar66.Max.x,(double)auVar61._0_4_,
                                 (double)(IVar66.Max.x - IVar66.Min.x),
                                 (double)(auVar61._0_4_ - auVar48._0_4_),uVar27,
                                 trt_rects_names[uVar25]);
                  local_1e0.x = 0.0;
                  local_1e0.y = 0.0;
                  Selectable(buf,false,0,&local_1e0);
                  bVar10 = IsItemHovered(0);
                  if (bVar10) {
                    pIVar12 = GetForegroundDrawList();
                    auVar31._0_4_ = (float)local_198._0_4_ + -1.0;
                    auVar31._4_4_ = (float)local_198._4_4_ + -1.0;
                    auVar31._8_4_ = fStack_190 + -1.0;
                    auVar31._12_4_ = fStack_18c + -1.0;
                    local_1e0 = (ImVec2)vmovlps_avx(auVar31);
                    auVar32._0_4_ = (float)local_1d8._0_4_ + 1.0;
                    auVar32._4_4_ = (float)local_1d8._4_4_ + 1.0;
                    auVar32._8_4_ = fStack_1d0 + 1.0;
                    auVar32._12_4_ = fStack_1cc + 1.0;
                    local_1a0 = (ImVec2)vmovlps_avx(auVar32);
                    auVar51 = ZEXT464(0) << 0x20;
                    auVar39 = ZEXT464(0x40000000);
                    ImDrawList::AddRect(pIVar12,&local_1e0,&local_1a0,0xff00ffff,0.0,-1,2.0);
                  }
                  uVar27 = (ulong)(iVar22 + 1);
                }
              }
              uVar25 = uVar25 + 1;
            }
            auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
            Unindent(0.0);
            auVar26 = local_188;
            iVar24 = (int)local_1a8;
          }
        }
      }
    }
    TreePop();
  }
  local_198 = (undefined1  [8])&pIVar8->Windows;
  DebugNodeWindowsList(&pIVar8->Windows,"Windows");
  this_00 = &pIVar8->Viewports;
  uVar21 = 0;
  for (iVar24 = 0; iVar24 < this_00->Size; iVar24 = iVar24 + 1) {
    ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar24);
    uVar21 = uVar21 + ((*ppIVar13)->DrawDataBuilder).Layers[1].Size +
             ((*ppIVar13)->DrawDataBuilder).Layers[0].Size;
  }
  iVar24 = 0;
  bVar10 = TreeNode("DrawLists","DrawLists (%d)",(ulong)uVar21);
  if (bVar10) {
    for (; local_1a8 = this_00, this_00 = local_1a8, iVar24 < local_1a8->Size; iVar24 = iVar24 + 1)
    {
      ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](local_1a8,iVar24);
      pIVar5 = *ppIVar13;
      for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
        this_01 = (pIVar5->DrawDataBuilder).Layers + lVar20;
        for (iVar22 = 0; iVar22 < this_01->Size; iVar22 = iVar22 + 1) {
          ppIVar14 = ImVector<ImDrawList_*>::operator[](this_01,iVar22);
          DebugNodeDrawList((ImGuiWindow *)0x0,*ppIVar14,"DrawList");
        }
      }
      this_00 = local_1a8;
    }
    TreePop();
  }
  iVar24 = 0;
  bVar10 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)this_00->Size);
  if (bVar10) {
    fVar28 = GetTreeNodeToLabelSpacing();
    Indent(fVar28);
    pIVar6 = GImGui->CurrentWindow;
    this_02 = &GImGui->Viewports;
    _local_1d8 = _DAT_001d49c0;
    auVar61 = _DAT_001d49c0;
    while( true ) {
      auVar59 = auVar39._8_56_;
      auVar46 = ZEXT856(auVar61._8_8_);
      iVar22 = this_02->Size;
      if (iVar22 <= iVar24) break;
      ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](this_02,iVar24);
      IVar66 = ImGuiViewportP::GetMainRect(*ppIVar13);
      auVar55._0_8_ = IVar66.Max;
      auVar55._8_56_ = auVar59;
      auVar41._0_8_ = IVar66.Min;
      auVar41._8_56_ = auVar46;
      auVar61 = vshufps_avx(auVar55._0_16_,auVar41._0_16_,0x11);
      auVar48 = vcmpps_avx(auVar61,_local_1d8,1);
      auVar62 = vcmpps_avx(_local_1d8,auVar61,1);
      auVar49._8_8_ = auVar48._8_8_;
      auVar49._0_8_ = auVar62._0_8_;
      auVar39 = ZEXT1664(auVar49);
      _local_1d8 = vblendvps_avx(_local_1d8,auVar61,auVar49);
      iVar24 = iVar24 + 1;
    }
    auVar35._8_8_ = 0;
    auVar35._0_4_ = (pIVar6->DC).CursorPos.x;
    auVar35._4_4_ = (pIVar6->DC).CursorPos.y;
    local_178 = vshufpd_avx(_local_1d8,_local_1d8,1);
    auVar61 = vshufps_avx(_local_1d8,_local_1d8,0x4b);
    auVar50._0_4_ = auVar61._0_4_ * 0.125;
    auVar50._4_4_ = auVar61._4_4_ * 0.125;
    auVar50._8_4_ = auVar61._8_4_ * 0.125;
    auVar50._12_4_ = auVar61._12_4_ * 0.125;
    _local_188 = vsubps_avx(auVar35,auVar50);
    for (iVar24 = 0; iVar24 < iVar22; iVar24 = iVar24 + 1) {
      ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](this_02,iVar24);
      pIVar5 = *ppIVar13;
      IVar3 = (pIVar5->super_ImGuiViewport).Pos;
      IVar4 = (pIVar5->super_ImGuiViewport).Size;
      fVar28 = IVar3.x;
      fVar45 = IVar3.y;
      auVar60._0_4_ = (float)local_188._0_4_ + fVar28 * 0.125;
      auVar60._4_4_ = (float)local_188._4_4_ + fVar45 * 0.125;
      auVar60._8_4_ = fStack_180 + 0.0;
      auVar60._12_4_ = fStack_17c + 0.0;
      auVar36._0_4_ = (float)local_188._0_4_ + (fVar28 + IVar4.x) * 0.125;
      auVar36._4_4_ = (float)local_188._4_4_ + (fVar45 + IVar4.y) * 0.125;
      auVar36._8_4_ = fStack_180 + 0.0;
      auVar36._12_4_ = fStack_17c + 0.0;
      buf._0_16_ = vmovlhps_avx(auVar60,auVar36);
      DebugRenderViewportThumbnail(pIVar6->DrawList,pIVar5,(ImRect *)buf);
      iVar22 = this_02->Size;
    }
    auVar61 = vsubps_avx(_local_1d8,local_178);
    auVar61 = vshufps_avx(auVar61,auVar61,0xe1);
    auVar39 = ZEXT1664(CONCAT412(0x3e000000,CONCAT48(0x3e000000,0x3e0000003e000000)));
    auVar37._0_4_ = auVar61._0_4_ * 0.125;
    auVar37._4_4_ = auVar61._4_4_ * 0.125;
    auVar37._8_4_ = auVar61._8_4_ * 0.125;
    auVar37._12_4_ = auVar61._12_4_ * 0.125;
    uVar64 = vmovlps_avx(auVar37);
    buf[0] = (char)uVar64;
    buf[1] = (char)((ulong)uVar64 >> 8);
    buf[2] = (char)((ulong)uVar64 >> 0x10);
    buf[3] = (char)((ulong)uVar64 >> 0x18);
    buf[4] = (char)((ulong)uVar64 >> 0x20);
    buf[5] = (char)((ulong)uVar64 >> 0x28);
    buf[6] = (char)((ulong)uVar64 >> 0x30);
    buf[7] = (char)((ulong)uVar64 >> 0x38);
    Dummy((ImVec2 *)buf);
    auVar51._0_4_ = GetTreeNodeToLabelSpacing();
    auVar51._4_60_ = extraout_var;
    Unindent(auVar51._0_4_);
    for (iVar24 = 0; iVar24 < this_00->Size; iVar24 = iVar24 + 1) {
      ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar24);
      DebugNodeViewport(*ppIVar13);
    }
    TreePop();
  }
  bVar10 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar8->OpenPopupStack).Size);
  if (bVar10) {
    this = &pIVar8->OpenPopupStack;
    for (iVar24 = 0; iVar24 < this->Size; iVar24 = iVar24 + 1) {
      pIVar15 = ImVector<ImGuiPopupData>::operator[](this,iVar24);
      pIVar6 = pIVar15->Window;
      pIVar15 = ImVector<ImGuiPopupData>::operator[](this,iVar24);
      pcVar18 = "";
      pcVar19 = "NULL";
      pcVar23 = "";
      if (pIVar6 != (ImGuiWindow *)0x0) {
        pcVar19 = pIVar6->Name;
        pcVar18 = " ChildWindow";
        if (((uint)pIVar6->Flags >> 0x18 & 1) == 0) {
          pcVar18 = "";
        }
        pcVar23 = " ChildMenu";
        if (((uint)pIVar6->Flags >> 0x1c & 1) == 0) {
          pcVar23 = "";
        }
      }
      BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar15->PopupId,pcVar19,pcVar18,pcVar23
                );
    }
    TreePop();
  }
  iVar24 = 0;
  bVar10 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar8->TabBars).Buf.Size);
  if (bVar10) {
    for (; iVar24 < (pIVar8->TabBars).Buf.Size; iVar24 = iVar24 + 1) {
      tab_bar = ImVector<ImGuiTabBar>::operator[](&(pIVar8->TabBars).Buf,iVar24);
      DebugNodeTabBar(tab_bar,"TabBar");
    }
    TreePop();
  }
  auVar26 = (undefined1  [8])&pIVar8->Tables;
  iVar24 = 0;
  bVar10 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar8->Tables).Buf.Size);
  uVar64 = auVar63._8_8_;
  if (bVar10) {
    for (; uVar64 = auVar63._8_8_, iVar24 < (((ImPool<ImGuiTable> *)auVar26)->Buf).Size;
        iVar24 = iVar24 + 1) {
      pIVar11 = ImVector<ImGuiTable>::operator[]((ImVector<ImGuiTable> *)auVar26,iVar24);
      DebugNodeTable(pIVar11);
    }
    TreePop();
  }
  bVar10 = TreeNode("Settings");
  if (bVar10) {
    bVar10 = SmallButton("Clear");
    if (bVar10) {
      ClearIniSettings();
    }
    SameLine(0.0,-1.0);
    bVar10 = SmallButton("Save to memory");
    if (bVar10) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    SameLine(0.0,-1.0);
    bVar10 = SmallButton("Save to disk");
    if (bVar10) {
      SaveIniSettingsToDisk((pIVar8->IO).IniFilename);
    }
    auVar39 = ZEXT464(0xbf800000);
    SameLine(0.0,-1.0);
    if ((pIVar8->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    auVar51 = ZEXT1664(CONCAT88(uVar64,(double)pIVar8->SettingsDirtyTimer));
    Text("SettingsDirtyTimer %.2f");
    bVar10 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar8->SettingsHandlers).Size);
    if (bVar10) {
      for (iVar24 = 0; iVar24 < (pIVar8->SettingsHandlers).Size; iVar24 = iVar24 + 1) {
        pIVar16 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar8->SettingsHandlers,iVar24);
        BulletText("%s",pIVar16->TypeName);
      }
      TreePop();
    }
    bVar10 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar8->SettingsWindows).Buf.Size);
    if (bVar10) {
      settings = (ImGuiWindowSettings *)(pIVar8->SettingsWindows).Buf.Data;
      if (settings != (ImGuiWindowSettings *)0x0) {
        settings = (ImGuiWindowSettings *)&settings->Pos;
      }
      for (; settings != (ImGuiWindowSettings *)0x0;
          settings = ImChunkStream<ImGuiWindowSettings>::next_chunk
                               (&pIVar8->SettingsWindows,settings)) {
        DebugNodeWindowSettings(settings);
      }
      TreePop();
    }
    bVar10 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar8->SettingsTables).Buf.Size);
    if (bVar10) {
      settings_00 = (ImGuiTableSettings *)(pIVar8->SettingsTables).Buf.Data;
      if (settings_00 != (ImGuiTableSettings *)0x0) {
        settings_00 = (ImGuiTableSettings *)&settings_00->SaveFlags;
      }
      for (; settings_00 != (ImGuiTableSettings *)0x0;
          settings_00 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                  (&pIVar8->SettingsTables,settings_00)) {
        DebugNodeTableSettings(settings_00);
      }
      TreePop();
    }
    iVar24 = (pIVar8->SettingsIniData).Buf.Size;
    uVar25 = (ulong)(iVar24 - 1);
    if (iVar24 == 0) {
      uVar25 = 0;
    }
    bVar10 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar25);
    if (bVar10) {
      pcVar19 = (pIVar8->SettingsIniData).Buf.Data;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = ImGuiTextBuffer::EmptyString;
      }
      fVar28 = GImGui->FontSize * 20.0;
      auVar51 = ZEXT464((uint)fVar28);
      buf._4_4_ = fVar28;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = -0x80;
      InputTextMultiline("##Ini",pcVar19,(long)(pIVar8->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar10 = TreeNode("Internal state");
  if (bVar10) {
    pcVar18 = "NULL";
    Text("WINDOWING");
    Indent(0.0);
    pcVar19 = "NULL";
    if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar8->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar8->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar19);
    pcVar19 = "NULL";
    if (pIVar8->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar19);
    Unindent(0.0);
    Text("ITEMS");
    Indent(0.0);
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         (double)pIVar8->ActiveIdTimer,(ulong)pIVar8->ActiveId,(ulong)pIVar8->ActiveIdPreviousFrame,
         (ulong)pIVar8->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_0029faa0 + (ulong)pIVar8->ActiveIdSource * 8));
    pcVar19 = "NULL";
    if (pIVar8->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar19);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(ulong)pIVar8->HoveredId,
         (ulong)pIVar8->HoveredIdPreviousFrame,(ulong)pIVar8->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar8->DragDropActive,
         (ulong)(pIVar8->DragDropPayload).SourceId,(pIVar8->DragDropPayload).DataType,
         (ulong)(uint)(pIVar8->DragDropPayload).DataSize);
    Unindent(0.0);
    Text("NAV,FOCUS");
    Indent(0.0);
    pcVar19 = "NULL";
    if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar8->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar19);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar8->NavId,(ulong)pIVar8->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_0029faa0 + (ulong)pIVar8->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar8->IO).NavActive,
         (ulong)(pIVar8->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar8->NavActivateId,
         (ulong)pIVar8->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar8->NavDisableHighlight,
         (ulong)pIVar8->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar8->NavFocusScopeId);
    if (pIVar8->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar18 = pIVar8->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar18);
    auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
    Unindent(0.0);
    TreePop();
  }
  if ((local_1b0->ShowWindowsRects != false) ||
     ((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true)) {
    for (iVar24 = 0; iVar24 < ((ImVector<ImGuiWindow_*> *)local_198)->Size; iVar24 = iVar24 + 1) {
      ppIVar17 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)local_198,iVar24);
      pIVar6 = *ppIVar17;
      if (pIVar6->WasActive == true) {
        pIVar12 = GetForegroundDrawList();
        auVar59 = auVar39._8_56_;
        auVar46 = auVar51._8_56_;
        if (local_1b0->ShowWindowsRects == true) {
          IVar66 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar6,*local_1b8);
          auVar56._0_8_ = IVar66.Max;
          auVar56._8_56_ = auVar59;
          auVar42._0_8_ = IVar66.Min;
          auVar42._8_56_ = auVar46;
          buf._0_16_ = vmovlhps_avx(auVar42._0_16_,auVar56._0_16_);
          auVar51 = ZEXT864(0) << 0x20;
          auVar39 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        if (((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar6->Flags & 0x1000000) == 0)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar6->BeginOrderWithinContext);
          fVar28 = GImGui->FontSize;
          IVar3 = pIVar6->Pos;
          auVar39 = ZEXT864((ulong)IVar3);
          auVar38._0_4_ = fVar28 + IVar3.x;
          auVar38._4_4_ = fVar28 + IVar3.y;
          auVar38._8_4_ = fVar28 + 0.0;
          auVar38._12_4_ = fVar28 + 0.0;
          local_1e0 = (ImVec2)vmovlps_avx(auVar38);
          auVar51 = ZEXT464(0) << 0x20;
          ImDrawList::AddRectFilled(pIVar12,&pIVar6->Pos,&local_1e0,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(pIVar12,&pIVar6->Pos,0xffffffff,buf,(char *)0x0);
        }
      }
    }
  }
  if ((pIVar8->DebugMetricsConfig).ShowTablesRects == true) {
    local_1d8 = auVar26;
    for (iVar24 = 0; iVar24 < ((ImVector<ImGuiTable> *)auVar26)->Size; iVar24 = iVar24 + 1) {
      pIVar11 = ImVector<ImGuiTable>::operator[]((ImVector<ImGuiTable> *)auVar26,iVar24);
      if (pIVar8->FrameCount + -1 <= pIVar11->LastFrameActive) {
        pIVar12 = GetForegroundDrawList();
        auVar59 = auVar39._8_56_;
        auVar46 = auVar51._8_56_;
        if (*local_1c0 < 6) {
          IVar66 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,*local_1c0,-1);
          auVar58._0_8_ = IVar66.Max;
          auVar58._8_56_ = auVar59;
          auVar44._0_8_ = IVar66.Min;
          auVar44._8_56_ = auVar46;
          buf._0_16_ = vmovlhps_avx(auVar44._0_16_,auVar58._0_16_);
          auVar51 = ZEXT864(0) << 0x20;
          auVar39 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        else {
          iVar22 = 0;
          while( true ) {
            auVar59 = auVar39._8_56_;
            auVar46 = auVar51._8_56_;
            if (pIVar11->ColumnsCount <= iVar22) break;
            IVar66 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,*local_1c0,iVar22);
            auVar57._0_8_ = IVar66.Max;
            auVar57._8_56_ = auVar59;
            auVar43._0_8_ = IVar66.Min;
            auVar43._8_56_ = auVar46;
            buf._0_16_ = vmovlhps_avx(auVar43._0_16_,auVar57._0_16_);
            bVar10 = iVar22 == pIVar11->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar10) {
              col = 0xff80ffff;
            }
            auVar39 = ZEXT464((uint)*(float *)(&DAT_001d4af0 + (ulong)bVar10 * 4));
            auVar51 = ZEXT864(0) << 0x20;
            ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                *(float *)(&DAT_001d4af0 + (ulong)bVar10 * 4));
            iVar22 = iVar22 + 1;
          }
        }
      }
      auVar26 = local_1d8;
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}